

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pushdown_tests.cpp
# Opt level: O2

void __thiscall afsm::test::Pushdown_ToTheEnd_Test::TestBody(Pushdown_ToTheEnd_Test *this)

{
  event_process_result eVar1;
  char *in_R9;
  AssertHelper local_1c0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar__1;
  json_parser_fsm fsm;
  
  state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
  ::state_machine(&fsm);
  gtest_ar_.success_ = true;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar__1.success_ =
       detail::
       orthogonal_state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
       ::is_in_state<afsm::test::json_parser_def::context::start>
                 ((orthogonal_state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                   *)&fsm);
  gtest_ar__1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!gtest_ar__1.success_) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
               (AssertionResult *)"fsm.is_in_state<json_parser_fsm::context::start>()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/pushdown_tests.cpp"
               ,0x10c,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_1b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  eVar1 = state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
          ::process_event<afsm::test::events::bool_literal>(&fsm,(bool_literal *)&gtest_ar_);
  gtest_ar__1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  gtest_ar__1.success_ = (eVar1 & ~defer) == process_in_state;
  if (!gtest_ar__1.success_) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
               (AssertionResult *)"done(fsm.process_event(events::bool_literal{}))","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/pushdown_tests.cpp"
               ,0x10d,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_1b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  gtest_ar__1.success_ =
       detail::
       orthogonal_state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
       ::is_in_state<afsm::test::json_parser_def::context::end>
                 ((orthogonal_state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                   *)&fsm);
  gtest_ar__1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!gtest_ar__1.success_) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
               (AssertionResult *)"fsm.is_in_state<json_parser_fsm::context::end>()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/pushdown_tests.cpp"
               ,0x10e,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_1b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
  ::~state_machine(&fsm);
  return;
}

Assistant:

TEST(Pushdown, ToTheEnd)
{
    json_parser_fsm fsm;

    EXPECT_TRUE(fsm.is_in_state<json_parser_def>());
    EXPECT_TRUE(fsm.is_in_state<json_parser_fsm::context::start>());
    EXPECT_TRUE(done(fsm.process_event(events::bool_literal{})));
    EXPECT_TRUE(fsm.is_in_state<json_parser_fsm::context::end>());
}